

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O0

bool try_quantize_rgb_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  undefined1 auVar1 [16];
  vfloat4 valuef;
  vfloat4 valuef_00;
  vint4 value;
  vint4 value_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  longlong *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  float quant_level_00;
  longlong lVar18;
  undefined8 uVar19;
  undefined8 in_XMM0_Qb;
  longlong lVar20;
  undefined8 uVar21;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  vint4 color1i;
  vint4 color0i;
  vmask4 color1_error;
  vmask4 color0_error;
  longlong lVar22;
  undefined8 uVar23;
  longlong lVar24;
  longlong lVar25;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined1 local_b68 [16];
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined1 local_b28 [16];
  undefined8 local_b18;
  longlong lStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [16];
  undefined8 local_ae8;
  longlong lStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a68;
  undefined8 uStack_a60;
  longlong *local_a48;
  undefined8 *local_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined1 local_a28 [19];
  bool local_a15;
  undefined4 local_a14;
  undefined1 *local_a10;
  undefined4 local_a04;
  undefined1 *local_a00;
  undefined4 local_9f4;
  undefined1 *local_9f0;
  undefined4 local_9e4;
  undefined1 *local_9e0;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_928;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_8f8;
  longlong lStack_8f0;
  undefined8 *local_8e8;
  undefined1 *local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 *local_848;
  undefined8 *local_840;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 *local_818;
  undefined1 *local_810;
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined1 local_7b8 [16];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined1 local_788 [16];
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 local_758 [16];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined1 local_728 [16];
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  longlong lStack_700;
  undefined1 local_6f8 [16];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined1 local_6c8 [16];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  longlong lStack_6a0;
  undefined1 local_698 [16];
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined1 local_668 [16];
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined1 local_628 [20];
  undefined4 local_614;
  undefined1 *local_610;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined4 local_5ec;
  undefined1 local_5e8 [16];
  undefined8 local_5d8;
  longlong lStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [20];
  undefined4 local_594;
  undefined1 *local_590;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined4 local_56c;
  int local_568;
  undefined4 uStack_564;
  int local_538;
  undefined4 uStack_534;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  longlong lStack_4f0;
  undefined1 local_4e8 [16];
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined1 local_498 [16];
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 *local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_448 [16];
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined1 *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined1 local_3f8 [16];
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  longlong lStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_290;
  undefined1 local_288 [16];
  undefined1 *local_270;
  undefined1 local_268 [16];
  undefined1 *local_250;
  undefined1 local_248 [16];
  undefined1 *local_230;
  undefined1 local_228 [16];
  undefined1 *local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  longlong lStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  longlong lStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 *local_f0;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined1 *local_d0;
  int local_c8;
  int local_a8;
  int local_68;
  int local_48;
  
  local_8e0 = local_a28;
  auVar10._8_8_ = in_XMM0_Qb;
  auVar10._0_8_ = in_XMM0_Qa;
  local_7f8 = vpermilps_avx(auVar10,0xea);
  local_7e0 = local_808;
  local_a88 = local_7f8._0_8_;
  uStack_a80 = local_7f8._8_8_;
  local_888 = local_7f8._0_8_;
  uStack_880 = local_7f8._8_8_;
  local_348 = local_7f8._0_8_;
  uStack_340 = local_7f8._8_8_;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  local_858 = vsubps_avx(auVar1,local_7f8);
  local_848 = local_868;
  local_a68 = local_858._0_8_;
  uStack_a60 = local_858._8_8_;
  local_8e8 = &local_a68;
  local_918 = local_858._0_8_;
  uStack_910 = local_858._8_8_;
  local_398 = (float)in_XMM0_Qa;
  fStack_394 = (float)((ulong)in_XMM0_Qa >> 0x20);
  fStack_390 = (float)in_XMM0_Qb;
  fStack_38c = (float)((ulong)in_XMM0_Qb >> 0x20);
  local_3a8._0_4_ = local_858._0_4_;
  local_3a8._4_4_ = local_858._4_4_;
  uStack_3a0._0_4_ = local_858._8_4_;
  uStack_3a0._4_4_ = local_858._12_4_;
  local_438 = local_398 + (float)local_3a8;
  quant_level_00 = fStack_394 + local_3a8._4_4_;
  fStack_430 = fStack_390 + (float)uStack_3a0;
  fStack_42c = fStack_38c + uStack_3a0._4_4_;
  local_420 = local_448;
  uVar23 = CONCAT44(quant_level_00,local_438);
  lVar22 = CONCAT44(fStack_42c,fStack_430);
  local_920 = &local_a38;
  auVar9._8_8_ = in_XMM1_Qb;
  auVar9._0_8_ = in_XMM1_Qa;
  local_828 = vpermilps_avx(auVar9,0xea);
  local_818 = local_838;
  local_ab8 = local_828._0_8_;
  uStack_ab0 = local_828._8_8_;
  local_8d8 = local_828._0_8_;
  uStack_8d0 = local_828._8_8_;
  local_328 = local_828._0_8_;
  uStack_320 = local_828._8_8_;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  local_8a8 = vsubps_avx(auVar2,local_828);
  local_890 = local_8b8;
  local_a98 = local_8a8._0_8_;
  uStack_a90 = local_8a8._8_8_;
  local_928 = &local_a98;
  local_958 = local_8a8._0_8_;
  uStack_950 = local_8a8._8_8_;
  local_3b8 = (float)in_XMM1_Qa;
  fStack_3b4 = (float)((ulong)in_XMM1_Qa >> 0x20);
  fStack_3b0 = (float)in_XMM1_Qb;
  fStack_3ac = (float)((ulong)in_XMM1_Qb >> 0x20);
  local_3c8._0_4_ = local_8a8._0_4_;
  local_3c8._4_4_ = local_8a8._4_4_;
  uStack_3c0._0_4_ = local_8a8._8_4_;
  uStack_3c0._4_4_ = local_8a8._12_4_;
  local_3e8 = local_3b8 + (float)local_3c8;
  fStack_3e4 = fStack_3b4 + local_3c8._4_4_;
  fStack_3e0 = fStack_3b0 + (float)uStack_3c0;
  fStack_3dc = fStack_3ac + uStack_3c0._4_4_;
  local_3d0 = local_3f8;
  local_b88 = CONCAT44(fStack_3e4,local_3e8);
  uStack_b80 = CONCAT44(fStack_3dc,fStack_3e0);
  local_a10 = local_af8;
  local_a14 = 0;
  local_95c = 0;
  local_978 = 0;
  uStack_974 = 0;
  uStack_970 = 0;
  uStack_96c = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  auVar3._8_8_ = lVar22;
  auVar3._0_8_ = uVar23;
  local_268 = vcmpps_avx(auVar3,ZEXT816(0),1);
  local_250 = local_6f8;
  local_ad8 = local_268._0_8_;
  uStack_ad0 = local_268._8_8_;
  local_a00 = local_b28;
  local_a04 = 0x437f0000;
  local_97c = 0x437f0000;
  local_998 = 0x437f0000;
  uStack_994 = 0x437f0000;
  uStack_990 = 0x437f0000;
  uStack_98c = 0x437f0000;
  local_6b8 = 0x437f0000437f0000;
  uStack_6b0 = 0x437f0000437f0000;
  local_188 = 0x437f0000437f0000;
  uStack_180 = 0x437f0000437f0000;
  auVar5._8_8_ = 0x437f0000437f0000;
  auVar5._0_8_ = 0x437f0000437f0000;
  auVar6._8_8_ = lVar22;
  auVar6._0_8_ = uVar23;
  local_2a8 = vcmpps_avx(auVar5,auVar6,1);
  local_290 = local_698;
  local_b08 = local_2a8._0_8_;
  uStack_b00 = local_2a8._8_8_;
  local_768 = local_268._0_8_;
  uStack_760 = local_268._8_8_;
  local_778 = local_2a8._0_8_;
  uStack_770 = local_2a8._8_8_;
  local_2f8 = local_268._0_8_;
  uStack_2f0 = local_268._8_8_;
  local_308 = local_2a8._0_8_;
  uStack_300 = local_2a8._8_8_;
  local_228 = vpor_avx(local_268,local_2a8);
  local_210 = local_758;
  local_ac8 = local_228._0_8_;
  uStack_ac0 = local_228._8_8_;
  local_9f0 = local_b68;
  local_9f4 = 0;
  local_99c = 0;
  local_9b8 = 0;
  uStack_9b4 = 0;
  uStack_9b0 = 0;
  uStack_9ac = 0;
  local_748 = 0;
  uStack_740 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  auVar4._8_8_ = uStack_b80;
  auVar4._0_8_ = local_b88;
  local_248 = vcmpps_avx(auVar4,ZEXT816(0),1);
  local_230 = local_728;
  local_b48 = local_248._0_8_;
  uStack_b40 = local_248._8_8_;
  local_9e0 = local_b98;
  local_9e4 = 0x437f0000;
  local_9bc = 0x437f0000;
  local_9d8 = 0x437f0000;
  uStack_9d4 = 0x437f0000;
  uStack_9d0 = 0x437f0000;
  uStack_9cc = 0x437f0000;
  local_6e8 = 0x437f0000437f0000;
  uStack_6e0 = 0x437f0000437f0000;
  local_168 = 0x437f0000437f0000;
  uStack_160 = 0x437f0000437f0000;
  auVar7._8_8_ = 0x437f0000437f0000;
  auVar7._0_8_ = 0x437f0000437f0000;
  auVar8._8_8_ = uStack_b80;
  auVar8._0_8_ = local_b88;
  local_288 = vcmpps_avx(auVar7,auVar8,1);
  local_270 = local_6c8;
  local_b78 = local_288._0_8_;
  uStack_b70 = local_288._8_8_;
  local_798 = local_248._0_8_;
  uStack_790 = local_248._8_8_;
  local_7a8 = local_288._0_8_;
  uStack_7a0 = local_288._8_8_;
  local_2d8 = local_248._0_8_;
  uStack_2d0 = local_248._8_8_;
  local_2e8 = local_288._0_8_;
  uStack_2e0 = local_288._8_8_;
  local_208 = vpor_avx(local_248,local_288);
  local_1f0 = local_788;
  local_b38 = local_208._0_8_;
  uStack_b30 = local_208._8_8_;
  local_7c8 = local_228._0_8_;
  uStack_7c0 = local_228._8_8_;
  local_7d8 = local_208._0_8_;
  uStack_7d0 = local_208._8_8_;
  local_2b8 = local_228._0_8_;
  uStack_2b0 = local_228._8_8_;
  local_2c8 = local_208._0_8_;
  uStack_2c0 = local_208._8_8_;
  local_1e8 = vpor_avx(local_228,local_208);
  local_1d0 = local_7b8;
  local_678 = local_1e8._0_8_;
  uStack_670 = local_1e8._8_8_;
  local_688 = local_1e8._0_8_;
  uStack_680 = local_1e8._8_8_;
  local_148 = local_1e8._0_8_;
  uStack_140 = local_1e8._8_8_;
  local_138 = local_1e8._0_8_;
  uStack_130 = local_1e8._8_8_;
  iVar17 = vmovmskps_avx(local_1e8);
  if (iVar17 == 0) {
    local_590 = local_5e8;
    local_594 = 0x3f000000;
    local_56c = 0x3f000000;
    local_588 = 0x3f000000;
    uStack_584 = 0x3f000000;
    uStack_580 = 0x3f000000;
    uStack_57c = 0x3f000000;
    local_508 = 0x3f0000003f000000;
    uStack_500 = 0x3f0000003f000000;
    local_368 = 0x3f0000003f000000;
    uStack_360 = 0x3f0000003f000000;
    local_4d8 = local_438 + 0.5;
    fStack_4d4 = quant_level_00 + 0.5;
    fStack_4d0 = fStack_430 + 0.5;
    fStack_4cc = fStack_42c + 0.5;
    local_4c0 = local_4e8;
    local_5c8 = CONCAT44(fStack_4d4,local_4d8);
    uStack_5c0 = CONCAT44(fStack_4cc,fStack_4d0);
    local_108 = (int)local_4d8;
    iStack_104 = (int)fStack_4d4;
    iStack_100 = (int)fStack_4d0;
    iStack_fc = (int)fStack_4cc;
    local_f0 = local_5a8;
    lVar18 = CONCAT44(iStack_104,local_108);
    lVar20 = CONCAT44(iStack_fc,iStack_100);
    value.m[1] = lVar18;
    value.m[0] = lVar22;
    valuef.m[2] = local_438;
    valuef.m[3] = quant_level_00;
    valuef.m[0] = fStack_430;
    valuef.m[1] = fStack_42c;
    lVar24 = lVar22;
    lVar25 = lVar18;
    local_b58 = local_b88;
    uStack_b50 = uStack_b80;
    local_b18 = uVar23;
    lStack_b10 = lVar22;
    local_ae8 = uVar23;
    lStack_ae0 = lVar22;
    local_a48 = in_RSI;
    local_a40 = in_RDI;
    local_a38 = local_b88;
    uStack_a30 = uStack_b80;
    local_938 = local_b88;
    uStack_930 = uStack_b80;
    local_8f8 = uVar23;
    lStack_8f0 = lVar22;
    local_840 = local_920;
    local_810 = local_8e0;
    local_738 = local_b88;
    uStack_730 = uStack_b80;
    local_708 = uVar23;
    lStack_700 = lVar22;
    local_6d8 = local_b88;
    uStack_6d0 = uStack_b80;
    local_6a8 = uVar23;
    lStack_6a0 = lVar22;
    local_5d8 = uVar23;
    lStack_5d0 = lVar22;
    local_5b8 = local_5c8;
    uStack_5b0 = uStack_5c0;
    local_4f8 = uVar23;
    lStack_4f0 = lVar22;
    local_468 = local_918;
    uStack_460 = uStack_910;
    fStack_434 = quant_level_00;
    local_418 = local_958;
    uStack_410 = uStack_950;
    local_3c8 = local_958;
    uStack_3c0 = uStack_950;
    local_3a8 = local_918;
    uStack_3a0 = uStack_910;
    local_358 = uVar23;
    lStack_350 = lVar22;
    local_1b8 = uVar23;
    lStack_1b0 = lVar22;
    local_198 = local_b88;
    uStack_190 = uStack_b80;
    local_178 = uVar23;
    lStack_170 = lVar22;
    local_158 = local_b88;
    uStack_150 = uStack_b80;
    local_128 = local_5c8;
    uStack_120 = uStack_5c0;
    quant_color3((quant_method)quant_level_00,value,valuef);
    local_658 = local_a38;
    uStack_650 = uStack_a30;
    local_610 = local_668;
    local_614 = 0x3f000000;
    local_5ec = 0x3f000000;
    local_608 = 0x3f000000;
    uStack_604 = 0x3f000000;
    uStack_600 = 0x3f000000;
    uStack_5fc = 0x3f000000;
    local_4a8 = local_a38;
    uStack_4a0 = uStack_a30;
    local_4b8 = 0x3f0000003f000000;
    uStack_4b0 = 0x3f0000003f000000;
    local_378 = local_a38;
    uVar15 = local_378;
    uStack_370 = uStack_a30;
    uVar16 = uStack_370;
    local_388 = 0x3f0000003f000000;
    uStack_380 = 0x3f0000003f000000;
    local_378._0_4_ = (float)local_a38;
    local_378._4_4_ = (float)((ulong)local_a38 >> 0x20);
    uStack_370._0_4_ = (float)uStack_a30;
    uStack_370._4_4_ = (float)((ulong)uStack_a30 >> 0x20);
    local_488 = (float)local_378 + 0.5;
    fStack_484 = local_378._4_4_ + 0.5;
    fStack_480 = (float)uStack_370 + 0.5;
    fStack_47c = uStack_370._4_4_ + 0.5;
    local_470 = local_498;
    local_648 = CONCAT44(fStack_484,local_488);
    uStack_640 = CONCAT44(fStack_47c,fStack_480);
    local_e8 = (int)local_488;
    iStack_e4 = (int)fStack_484;
    iStack_e0 = (int)fStack_480;
    iStack_dc = (int)fStack_47c;
    local_d0 = local_628;
    uVar19 = CONCAT44(iStack_e4,local_e8);
    uVar21 = CONCAT44(iStack_dc,iStack_e0);
    value_00.m[1] = lVar25;
    value_00.m[0] = lVar24;
    valuef_00.m[2] = (float)(int)uVar23;
    valuef_00.m[3] = (float)(int)((ulong)uVar23 >> 0x20);
    valuef_00.m[0] = (float)(int)lVar22;
    valuef_00.m[1] = (float)(int)((ulong)lVar22 >> 0x20);
    local_638 = local_648;
    uStack_630 = uStack_640;
    local_378 = uVar15;
    uStack_370 = uVar16;
    local_118 = local_648;
    uStack_110 = uStack_640;
    quant_color3((quant_method)quant_level_00,value_00,valuef_00);
    local_538 = (int)uVar19;
    auVar13._8_8_ = uVar21;
    auVar13._0_8_ = uVar19;
    auVar1 = vpshufd_avx(auVar13,1);
    local_a8 = auVar1._0_4_;
    auVar14._8_8_ = uVar21;
    auVar14._0_8_ = uVar19;
    auVar1 = vpshufd_avx(auVar14,2);
    local_c8 = auVar1._0_4_;
    local_568 = (int)lVar18;
    auVar11._8_8_ = lVar20;
    auVar11._0_8_ = lVar18;
    auVar1 = vpshufd_avx(auVar11,1);
    local_48 = auVar1._0_4_;
    auVar12._8_8_ = lVar20;
    auVar12._0_8_ = lVar18;
    auVar1 = vpshufd_avx(auVar12,2);
    local_68 = auVar1._0_4_;
    if (local_568 + local_48 + local_68 < local_538 + local_a8 + local_c8) {
      *local_a40 = uVar19;
      local_a40[1] = uVar21;
      *local_a48 = lVar18;
      local_a48[1] = lVar20;
      local_a15 = true;
    }
    else {
      local_a15 = false;
    }
  }
  else {
    local_a15 = false;
  }
  return local_a15;
}

Assistant:

static bool try_quantize_rgb_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Quantize the inverse blue-contracted color
	vint4 color0i = quant_color3(quant_level, float_to_int_rtn(color0), color0);
	vint4 color1i = quant_color3(quant_level, float_to_int_rtn(color1), color1);

	// If color #1 is not larger than color #0 then blue-contraction cannot be used
	// We must test afterwards because quantization can change the order
	if (hadd_rgb_s(color1i) <= hadd_rgb_s(color0i))
	{
		return false;
	}

	color0_out = color1i;
	color1_out = color0i;
	return true;
}